

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall fmt::v7::detail::stringifier::operator()[abi_cxx11_(stringifier *this,handle h)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RDI;
  format_context format_ctx;
  format_parse_context parse_ctx;
  memory_buffer buf;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_00;
  locale_ref local_2c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2b8;
  buffer_appender<char> local_2a8;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_2a0;
  char *local_278;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> local_268;
  allocator<char> local_239 [569];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (this_00,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(local_239);
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)&local_278);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::basic_format_parse_context
            (&local_268,local_278,in_stack_fffffffffffffd90,0);
  buffer_appender<char>::buffer_appender
            ((buffer_appender<char> *)this_00,&in_RDI->super_buffer<char>);
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(&local_2b8);
  locale_ref::locale_ref(&local_2c0);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::basic_format_context
            (&local_2a0,local_2a8,local_2b8,local_2c0);
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  handle::format((handle *)this_00,(parse_context_type *)in_RDI,
                 (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)0x13a77b);
  to_string<char,500ul>(in_stack_fffffffffffffd90);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return (string *)this_00;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }